

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

void Dau_DsdTruth6Compose_rec(word Func,word (*pFanins) [64],word *pRes,int nVars,int nWordsR)

{
  ulong uVar1;
  byte bVar2;
  int nVars_00;
  ulong uVar3;
  int iVar4;
  word local_438 [64];
  word local_238 [65];
  
  if (Func == 0xffffffffffffffff) {
    if (0 < nWordsR) {
      iVar4 = 0xff;
LAB_0049c462:
      memset(pRes,iVar4,(ulong)(uint)nWordsR << 3);
      return;
    }
  }
  else if (Func == 0) {
    if (0 < nWordsR) {
      iVar4 = 0;
      goto LAB_0049c462;
    }
  }
  else {
    uVar1 = (ulong)(uint)nVars + 1;
    iVar4 = nVars + -1;
    do {
      nVars_00 = iVar4;
      if (nVars_00 + 1 < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x1e1,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)");
      }
      if (nVars_00 == 0) {
        if ((Func != 0x5555555555555555) && (s_Truths6[0] != Func)) {
          __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0x1e4,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)"
                       );
        }
        if (Func != 0x5555555555555555) {
          if (nWordsR < 1) {
            return;
          }
          uVar1 = 0;
          do {
            pRes[uVar1] = (*pFanins)[uVar1];
            uVar1 = uVar1 + 1;
          } while ((uint)nWordsR != uVar1);
          return;
        }
        if (nWordsR < 1) {
          return;
        }
        uVar1 = 0;
        do {
          pRes[uVar1] = ~(*pFanins)[uVar1];
          uVar1 = uVar1 + 1;
        } while ((uint)nWordsR != uVar1);
        return;
      }
      bVar2 = (byte)(1 << ((byte)nVars_00 & 0x1f));
      uVar3 = uVar1 - 2 & 0xffffffff;
      uVar1 = uVar1 - 1;
      iVar4 = nVars_00 + -1;
    } while ((s_Truths6Neg[uVar3] & (Func >> (bVar2 & 0x3f) ^ Func)) == 0);
    if (6 < uVar1) {
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
    }
    uVar1 = s_Truths6Neg[uVar3] & Func;
    Dau_DsdTruth6Compose_rec(uVar1 << (bVar2 & 0x3f) | uVar1,pFanins,local_438,nVars_00,nWordsR);
    Dau_DsdTruth6Compose_rec
              ((Func & s_Truths6[uVar3]) >> (bVar2 & 0x3f) | Func & s_Truths6[uVar3],pFanins,
               local_238,nVars_00,nWordsR);
    if (0 < nWordsR) {
      uVar1 = 0;
      do {
        pRes[uVar1] = (local_238[uVar1] ^ local_438[uVar1]) & pFanins[uVar3][uVar1] ^
                      local_438[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)nWordsR != uVar1);
    }
  }
  return;
}

Assistant:

void Dau_DsdTruth6Compose_rec( word Func, word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], word * pRes, int nVars, int nWordsR )
{
    if ( Func == 0 )
    {
        Abc_TtConst0( pRes, nWordsR );
        return;
    }
    if ( Func == ~(word)0 )
    {
        Abc_TtConst1( pRes, nWordsR );
        return;
    }
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        Abc_TtCopy( pRes, pFanins[0], nWordsR, Func == s_Truths6Neg[0] );
        return;
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
    {
        Dau_DsdTruth6Compose_rec( Func, pFanins, pRes, nVars, nWordsR );
        return;
    }
    {
        word pTtTemp[2][DAU_MAX_WORD];
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, pTtTemp[0], nVars, nWordsR );
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, pTtTemp[1], nVars, nWordsR );
        Abc_TtMux( pRes, pFanins[nVars], pTtTemp[1], pTtTemp[0], nWordsR );
        return;
    }
}